

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::net::Socket_testFailConnect_Test::TestBody(Socket_testFailConnect_Test *this)

{
  char cVar1;
  socklen_t __len;
  sockaddr *__addr;
  int __fd;
  Message *pMVar2;
  Socket socket;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  Socket local_b0;
  long *local_a0 [17];
  
  jaegertracing::net::Socket::OSResource::OSResource(&local_b0._osResource);
  local_b0._handle = -1;
  local_b0._family = -1;
  local_b0._type = -1;
  Socket::open(&local_b0,(char *)0x2,1);
  cVar1 = testing::internal::AlwaysTrue();
  if (cVar1 != '\0') {
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"127.0.0.1","");
    __len = 2;
    jaegertracing::net::IPAddress::versionFromString((string *)local_a0,(int)local_d0,0x3039);
    Socket::connect(&local_b0,(int)local_a0,__addr,__len);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
  }
  testing::Message::Message((Message *)local_a0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_d0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/SocketTest.cpp"
             ,0x30,
             "Expected: socket.connect(IPAddress::v4(\"127.0.0.1\", 12345)) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
            );
  pMVar2 = (Message *)local_a0;
  testing::internal::AssertHelper::operator=((AssertHelper *)local_d0,pMVar2);
  __fd = (int)pMVar2;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d0);
  if (local_a0[0] != (long *)0x0) {
    cVar1 = testing::internal::IsTrue(true);
    if ((cVar1 != '\0') && (local_a0[0] != (long *)0x0)) {
      (**(code **)(*local_a0[0] + 8))();
    }
  }
  Socket::close(&local_b0,__fd);
  jaegertracing::net::Socket::OSResource::~OSResource(&local_b0._osResource);
  return;
}

Assistant:

TEST(Socket, testFailConnect)
{
    Socket socket;
    socket.open(AF_INET, SOCK_STREAM);
    ASSERT_THROW(socket.connect(IPAddress::v4("127.0.0.1", 12345)),
                 std::runtime_error);
}